

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O1

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::activeWait(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             *this)

{
  atomic<bool> *paVar1;
  task_handle *ptVar2;
  void *in_RSI;
  task_handle *hTask;
  task_handle *this_00;
  bool bVar3;
  
  ptVar2 = (this->tasks_).super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->tasks_).
                 super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != ptVar2; this_00 = this_00 + 1) {
    task_handle::validate(this_00);
    paVar1 = &((this_00->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->grabbed_;
    LOCK();
    bVar3 = (paVar1->_M_base)._M_i == false;
    if (bVar3) {
      (paVar1->_M_base)._M_i = true;
    }
    UNLOCK();
    if (bVar3) {
      task_handle::execute(this_00);
    }
  }
  notifier<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ::wait((notifier<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
          *)this,in_RSI);
  return;
}

Assistant:

virtual void activeWait() override final
        {
            for (auto &hTask : tasks_)
            {
                if (hTask.tryGrab())
                {
                    hTask.execute();
                }
            }

            this->wait();
        }